

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

dtime_tz_t duckdb::Cast::Operation<duckdb::string_t,duckdb::dtime_tz_t>(string_t input)

{
  string_t str;
  bool bVar1;
  ConversionException *this;
  undefined8 unaff_RBX;
  bool in_R8B;
  string_t input_00;
  dtime_tz_t result;
  undefined8 in_stack_ffffffffffffffd8;
  
  input_00.value._0_8_ = input.value._8_8_;
  input_00.value.pointer.ptr = (char *)&result;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::dtime_tz_t>
                    (input.value._0_8_,input_00,(dtime_tz_t *)0x0,in_R8B);
  if (bVar1) {
    return (dtime_tz_t)result.bits;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  str.value.pointer.ptr = (char *)unaff_RBX;
  str.value._0_8_ = in_stack_ffffffffffffffd8;
  Time::ConversionError_abi_cxx11_(str);
  ConversionException::ConversionException(this,(string *)&stack0xffffffffffffffc0);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

dtime_tz_t Cast::Operation(string_t input) {
	dtime_tz_t result;
	if (!TryCast::Operation(input, result, false)) {
		throw ConversionException(Time::ConversionError(input));
	}
	return result;
}